

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

timeval * event_base_init_common_timeout(event_base *base,timeval *duration)

{
  short *psVar1;
  int iVar2;
  ulong uVar3;
  __time_t *p_Var4;
  uint uVar5;
  common_timeout_list **ppcVar6;
  common_timeout_list *arg;
  ulong uVar7;
  long lVar8;
  char *fmt;
  __suseconds_t *p_Var9;
  timeval *ptVar10;
  ulong local_38;
  long local_30;
  
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,base->th_base_lock);
  }
  uVar7 = duration->tv_usec;
  p_Var9 = &duration->tv_usec;
  if (1000000 < (long)uVar7) {
    p_Var4 = &duration->tv_sec;
    if ((((uint)uVar7 & 0xf0000000) == 0x50000000) &&
       ((int)((uint)(uVar7 >> 0x14) & 0xff) < base->n_common_timeouts)) {
      uVar7 = (ulong)((uint)uVar7 & 0xfffff);
    }
    duration = (timeval *)&local_30;
    local_30 = *p_Var4 + uVar7 / 1000000;
    uVar7 = uVar7 % 1000000;
    local_38 = uVar7;
    p_Var9 = (__suseconds_t *)&local_38;
  }
  iVar2 = base->n_common_timeouts;
  if (0 < (long)iVar2) {
    lVar8 = 0;
    do {
      arg = base->common_timeout_queues[lVar8];
      if (duration->tv_sec == (arg->duration).tv_sec) {
        uVar3 = (arg->duration).tv_usec;
        uVar5 = (uint)uVar3;
        if (uVar7 == (uVar5 & 0xfffff)) {
          if (((uVar5 & 0xf0000000) != 0x50000000) || (iVar2 <= (int)((uint)(uVar3 >> 0x14) & 0xff))
             ) {
            event_base_init_common_timeout_cold_1();
          }
          goto LAB_001d95c8;
        }
      }
      lVar8 = lVar8 + 1;
    } while (iVar2 != lVar8);
    if (iVar2 == 0x100) {
      ptVar10 = (timeval *)0x0;
      event_warnx("%s: Too many common timeouts already in use; we only support %d per event_base",
                  "event_base_init_common_timeout",0x100);
      goto LAB_001d9610;
    }
  }
  if (base->n_common_timeouts_allocated == iVar2) {
    uVar7 = 0x10;
    if (0xf < iVar2) {
      uVar7 = (ulong)(uint)(iVar2 * 2);
    }
    if (mm_realloc_fn_ == (_func_void_ptr_void_ptr_size_t *)0x0) {
      ppcVar6 = (common_timeout_list **)realloc(base->common_timeout_queues,uVar7 * 8);
    }
    else {
      ppcVar6 = (common_timeout_list **)(*mm_realloc_fn_)(base->common_timeout_queues,uVar7 * 8);
    }
    if (ppcVar6 != (common_timeout_list **)0x0) {
      base->n_common_timeouts_allocated = (int)uVar7;
      base->common_timeout_queues = ppcVar6;
      goto LAB_001d950b;
    }
    fmt = "%s: realloc";
  }
  else {
LAB_001d950b:
    arg = (common_timeout_list *)event_mm_calloc_(1,0xa8);
    if (arg != (common_timeout_list *)0x0) {
      (arg->events).tqh_first = (event *)0x0;
      (arg->events).tqh_last = (event **)arg;
      (arg->duration).tv_sec = duration->tv_sec;
      (arg->duration).tv_usec = (long)(base->n_common_timeouts << 0x14) | *p_Var9 | 0x50000000;
      event_assign(&arg->timeout_event,base,-1,0,common_timeout_callback,arg);
      psVar1 = &(arg->timeout_event).ev_evcallback.evcb_flags;
      *(byte *)psVar1 = (byte)*psVar1 | 0x10;
      event_debug_assert_is_setup_(&arg->timeout_event);
      if ((((arg->timeout_event).ev_evcallback.evcb_flags & 8) == 0) &&
         (0 < ((arg->timeout_event).ev_base)->nactivequeues)) {
        (arg->timeout_event).ev_evcallback.evcb_pri = '\0';
      }
      arg->base = base;
      iVar2 = base->n_common_timeouts;
      base->n_common_timeouts = iVar2 + 1;
      base->common_timeout_queues[iVar2] = arg;
LAB_001d95c8:
      ptVar10 = &arg->duration;
      uVar5 = (uint)(arg->duration).tv_usec;
      if (((uVar5 & 0xf0000000) == 0x50000000) &&
         ((int)(uVar5 >> 0x14 & 0xff) < base->n_common_timeouts)) goto LAB_001d9610;
      event_base_init_common_timeout_cold_2();
    }
    fmt = "%s: calloc";
  }
  ptVar10 = (timeval *)0x0;
  event_warn(fmt,"event_base_init_common_timeout");
LAB_001d9610:
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
  }
  return ptVar10;
}

Assistant:

const struct timeval *
event_base_init_common_timeout(struct event_base *base,
    const struct timeval *duration)
{
	int i;
	struct timeval tv;
	const struct timeval *result=NULL;
	struct common_timeout_list *new_ctl;

	EVBASE_ACQUIRE_LOCK(base, th_base_lock);
	if (duration->tv_usec > 1000000) {
		memcpy(&tv, duration, sizeof(struct timeval));
		if (is_common_timeout(duration, base))
			tv.tv_usec &= MICROSECONDS_MASK;
		tv.tv_sec += tv.tv_usec / 1000000;
		tv.tv_usec %= 1000000;
		duration = &tv;
	}
	for (i = 0; i < base->n_common_timeouts; ++i) {
		const struct common_timeout_list *ctl =
		    base->common_timeout_queues[i];
		if (duration->tv_sec == ctl->duration.tv_sec &&
		    duration->tv_usec ==
		    (ctl->duration.tv_usec & MICROSECONDS_MASK)) {
			EVUTIL_ASSERT(is_common_timeout(&ctl->duration, base));
			result = &ctl->duration;
			goto done;
		}
	}
	if (base->n_common_timeouts == MAX_COMMON_TIMEOUTS) {
		event_warnx("%s: Too many common timeouts already in use; "
		    "we only support %d per event_base", __func__,
		    MAX_COMMON_TIMEOUTS);
		goto done;
	}
	if (base->n_common_timeouts_allocated == base->n_common_timeouts) {
		int n = base->n_common_timeouts < 16 ? 16 :
		    base->n_common_timeouts*2;
		struct common_timeout_list **newqueues =
		    mm_realloc(base->common_timeout_queues,
			n*sizeof(struct common_timeout_queue *));
		if (!newqueues) {
			event_warn("%s: realloc",__func__);
			goto done;
		}
		base->n_common_timeouts_allocated = n;
		base->common_timeout_queues = newqueues;
	}
	new_ctl = mm_calloc(1, sizeof(struct common_timeout_list));
	if (!new_ctl) {
		event_warn("%s: calloc",__func__);
		goto done;
	}
	TAILQ_INIT(&new_ctl->events);
	new_ctl->duration.tv_sec = duration->tv_sec;
	new_ctl->duration.tv_usec =
	    duration->tv_usec | COMMON_TIMEOUT_MAGIC |
	    (base->n_common_timeouts << COMMON_TIMEOUT_IDX_SHIFT);
	evtimer_assign(&new_ctl->timeout_event, base,
	    common_timeout_callback, new_ctl);
	new_ctl->timeout_event.ev_flags |= EVLIST_INTERNAL;
	event_priority_set(&new_ctl->timeout_event, 0);
	new_ctl->base = base;
	base->common_timeout_queues[base->n_common_timeouts++] = new_ctl;
	result = &new_ctl->duration;

done:
	if (result)
		EVUTIL_ASSERT(is_common_timeout(result, base));

	EVBASE_RELEASE_LOCK(base, th_base_lock);
	return result;
}